

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::Event::~Event(Event *this)

{
  long *in_FS_OFFSET;
  bool bVar1;
  Fault local_30;
  Fault f_1;
  Fault local_18;
  Fault f;
  Event *this_local;
  
  this->_vptr_Event = (_func_int **)&PTR_getInnerForTrace_007d86e8;
  if (this->prev != (Event **)0x0) {
    if (this->loop->tail == &this->next) {
      this->loop->tail = this->prev;
    }
    if (this->loop->depthFirstInsertPoint == &this->next) {
      this->loop->depthFirstInsertPoint = this->prev;
    }
    *this->prev = this->next;
    if (this->next != (Event *)0x0) {
      this->next->prev = this->prev;
    }
  }
  f.exception = (Exception *)this;
  if (((this->firing ^ 0xffU) & 1) != 0) {
    bVar1 = true;
    if (*(EventLoop **)(*in_FS_OFFSET + -0x10) != this->loop) {
      bVar1 = *(long *)(*in_FS_OFFSET + -0x10) == 0;
    }
    if (bVar1) {
      return;
    }
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x213,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
               "\"Promise destroyed from a different thread than it was created in.\"",
               (char (*) [66])"Promise destroyed from a different thread than it was created in.");
    Debug::Fault::fatal(&local_30);
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x211,FAILED,"!firing","\"Promise callback destroyed itself.\"",
             (char (*) [35])"Promise callback destroyed itself.");
  Debug::Fault::fatal(&local_18);
}

Assistant:

Event::~Event() noexcept(false) {
  if (prev != nullptr) {
    if (loop.tail == &next) {
      loop.tail = prev;
    }
    if (loop.depthFirstInsertPoint == &next) {
      loop.depthFirstInsertPoint = prev;
    }

    *prev = next;
    if (next != nullptr) {
      next->prev = prev;
    }
  }

  KJ_REQUIRE(!firing, "Promise callback destroyed itself.");
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Promise destroyed from a different thread than it was created in.");
}